

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestrategy.h
# Opt level: O2

void __thiscall
hedg::Base_Strategy::send_back_order
          (Base_Strategy *this,vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  Client<hedg::Rest_Client> *this_00;
  system_error e;
  string local_120;
  string local_100;
  string local_e0 [3];
  place_order<hedg::Back> local_80;
  
  this_00 = (this->client_)._M_t.
            super___uniq_ptr_impl<hedg::Client<hedg::Rest_Client>,_std::default_delete<hedg::Client<hedg::Rest_Client>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_hedg::Client<hedg::Rest_Client>_*,_std::default_delete<hedg::Client<hedg::Rest_Client>_>_>
            .super__Head_base<0UL,_hedg::Client<hedg::Rest_Client>_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)local_e0,(string *)&this->session_id_);
  std::__cxx11::string::string((string *)&local_100,(string *)&this->market_id_);
  std::__cxx11::string::string
            ((string *)&local_120,(string *)config::place_order_endpoint_abi_cxx11_);
  params::place_order<hedg::Back>::place_order(&local_80,local_e0,&local_100,orders,&local_120);
  Client<hedg::Rest_Client>::
  send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Back>>
            (this_00,rest::message<hedg::params::place_order<hedg::Back>>,&local_80);
  params::place_order<hedg::Back>::~place_order(&local_80);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void send_back_order(std::vector<Order>& orders) {
		try {
			client_->send_request(rest::message<params::place_order<Back> >,
				params::place_order<Back>(session_id_, market_id_, orders));
		}
		catch (boost::system::system_error e) {
			spdlog::error(e.what());
			spdlog::warn("Unable to send back order");
		}

	}